

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O1

int __thiscall
QuantizeData::threshold_distribution
          (QuantizeData *this,vector<float,_std::allocator<float>_> *distribution,int target_bin)

{
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  pointer pfVar1;
  pointer pfVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  size_type sVar8;
  QuantizeData *this_00;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar15;
  vector<float,_std::allocator<float>_> t_distribution;
  vector<float,_std::allocator<float>_> quantize_distribution;
  vector<float,_std::allocator<float>_> expand_distribution;
  float local_dc;
  allocator_type local_d5;
  float local_d4;
  ulong local_d0;
  int local_c8;
  float local_c4;
  uint local_c0;
  float local_bc;
  float local_b8;
  value_type_conflict local_b4;
  vector<float,_std::allocator<float>_> *local_b0;
  size_type local_a8;
  vector<float,_std::allocator<float>_> local_a0;
  vector<float,_std::allocator<float>_> local_88;
  undefined1 local_70 [32];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar9 = (ulong)((long)(distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  sVar8 = (size_type)target_bin;
  std::vector<float,_std::allocator<float>_>::vector(&local_88,sVar8,(allocator_type *)&local_a0);
  fVar11 = 0.0;
  iVar7 = (int)uVar9;
  if (target_bin < iVar7) {
    lVar5 = (long)target_bin;
    do {
      fVar11 = fVar11 + (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar7 != lVar5);
  }
  iVar4 = target_bin;
  local_d0 = uVar9;
  if (target_bin < iVar7) {
    local_c4 = (float)target_bin;
    uVar9 = (ulong)(uint)target_bin;
    local_dc = 1000.0;
    uVar10 = (ulong)(uint)target_bin;
    local_d4 = fVar11;
    local_c8 = target_bin;
    local_b0 = distribution;
    do {
      __first._M_current =
           (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<float,std::allocator<float>>::
      vector<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&local_a0,__first,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 (__first._M_current + sVar8),(allocator_type *)local_70);
      pfVar2 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar8 - 1] =
           local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[sVar8 - 1] + local_d4;
      pfVar1 = (distribution->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_d4 = local_d4 - pfVar1[sVar8];
      if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        memset(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-4 - (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
      }
      local_c0 = (uint)uVar10;
      fVar11 = (float)(int)sVar8 / local_c4;
      local_a8 = sVar8;
      if (0 < target_bin) {
        uVar10 = 0;
        do {
          fVar12 = (float)(int)uVar10 * fVar11;
          fVar13 = ceilf(fVar12);
          iVar7 = (int)fVar13;
          if (fVar12 < (float)(int)fVar13) {
            pfVar2[uVar10] =
                 ((float)(int)fVar13 - fVar12) * pfVar1[(long)iVar7 + -1] + pfVar2[uVar10];
          }
          fVar12 = fVar12 + fVar11;
          fVar13 = floorf(fVar12);
          iVar4 = (int)fVar13;
          if ((float)(int)fVar13 < fVar12) {
            pfVar2[uVar10] = (fVar12 - (float)(int)fVar13) * pfVar1[iVar4] + pfVar2[uVar10];
          }
          if (iVar7 < iVar4) {
            lVar5 = (long)iVar7;
            fVar12 = pfVar2[uVar10];
            do {
              fVar12 = fVar12 + pfVar1[lVar5];
              pfVar2[uVar10] = fVar12;
              lVar5 = lVar5 + 1;
            } while (iVar4 != lVar5);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar9);
      }
      local_b4 = 0.0;
      this_00 = (QuantizeData *)local_70;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)this_00,local_a8,&local_b4,&local_d5);
      uVar3 = local_70._0_8_;
      pfVar1 = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < target_bin) {
        pfVar2 = (local_b0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        do {
          fVar12 = (float)(int)uVar10 * fVar11;
          fVar13 = ceilf(fVar12);
          iVar7 = (int)fVar13;
          local_48 = (float)(int)fVar13;
          fStack_44 = (float)(int)extraout_XMM0_Db;
          fStack_40 = (float)(int)extraout_XMM0_Dc;
          fStack_3c = (float)(int)extraout_XMM0_Dd;
          local_bc = 0.0;
          local_70._24_4_ = 0.0;
          local_70._28_4_ = 0.0;
          fStack_50 = 0.0;
          fStack_4c = 0.0;
          if (fVar12 < local_48) {
            local_bc = local_48 - fVar12;
            if ((pfVar2[(long)iVar7 + -1] != 0.0) || (NAN(pfVar2[(long)iVar7 + -1]))) {
              local_70._24_4_ = local_bc;
              local_70._28_4_ = fStack_44;
              fStack_50 = fStack_40;
              fStack_4c = fStack_3c;
            }
          }
          local_b8 = fVar11 + fVar12;
          fVar13 = floorf(local_b8);
          iVar4 = (int)fVar13;
          fVar14 = (float)(int)fVar13;
          lVar5 = (long)iVar4;
          fVar13 = (float)local_70._24_4_;
          if (local_b8 <= fVar14) {
            fVar15 = 0.0;
          }
          else {
            fVar15 = local_b8 - fVar14;
            if ((pfVar2[lVar5] != 0.0) || (NAN(pfVar2[lVar5]))) {
              fVar13 = (float)local_70._24_4_ + fVar15;
            }
          }
          if (iVar7 < iVar4) {
            lVar6 = (long)iVar7;
            do {
              fVar13 = (float)(~-(uint)(pfVar2[lVar6] != 0.0) & (uint)fVar13 |
                              (uint)(fVar13 + 1.0) & -(uint)(pfVar2[lVar6] != 0.0));
              lVar6 = lVar6 + 1;
            } while (lVar5 != lVar6);
          }
          fVar13 = pfVar1[uVar10] / fVar13;
          if (fVar12 < local_48) {
            if ((pfVar2[(long)iVar7 + -1] != 0.0) || (NAN(pfVar2[(long)iVar7 + -1]))) {
              lVar6 = (long)iVar7 + -1;
              *(float *)(uVar3 + lVar6 * 4) = local_bc * fVar13 + *(float *)(uVar3 + lVar6 * 4);
            }
          }
          if ((fVar14 < local_b8) && ((pfVar2[lVar5] != 0.0 || (NAN(pfVar2[lVar5]))))) {
            *(float *)(uVar3 + lVar5 * 4) = fVar15 * fVar13 + *(float *)(uVar3 + lVar5 * 4);
          }
          if (iVar7 < iVar4) {
            lVar6 = (long)iVar7;
            do {
              if ((pfVar2[lVar6] != 0.0) || (NAN(pfVar2[lVar6]))) {
                *(float *)(local_70._0_8_ + lVar6 * 4) =
                     *(float *)(local_70._0_8_ + lVar6 * 4) + fVar13;
              }
              lVar6 = lVar6 + 1;
            } while (lVar5 != lVar6);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar9);
      }
      fVar11 = compute_kl_divergence
                         (this_00,&local_a0,(vector<float,_std::allocator<float>_> *)local_70);
      sVar8 = local_a8;
      uVar10 = (ulong)local_c0;
      if (fVar11 < local_dc) {
        uVar10 = local_a8 & 0xffffffff;
      }
      iVar4 = (int)uVar10;
      if ((pointer)local_70._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ - local_70._0_8_);
      }
      distribution = local_b0;
      target_bin = local_c8;
      if (local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_dc <= fVar11) {
        fVar11 = local_dc;
      }
      sVar8 = sVar8 + 1;
      local_dc = fVar11;
    } while ((int)sVar8 != (int)local_d0);
  }
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int QuantizeData::threshold_distribution(const std::vector<float> &distribution, const int target_bin) 
{
    int target_threshold = target_bin;
    float min_kl_divergence = 1000;
    const int length = distribution.size();

    std::vector<float> quantize_distribution(target_bin);

    float threshold_sum = 0;
    for (int threshold=target_bin; threshold<length; threshold++) 
    {
        threshold_sum += distribution[threshold];
    }

    for (int threshold=target_bin; threshold<length; threshold++) 
    {

        std::vector<float> t_distribution(distribution.begin(), distribution.begin()+threshold);
        
        t_distribution[threshold-1] += threshold_sum; 
        threshold_sum -= distribution[threshold];

        // get P
        fill(quantize_distribution.begin(), quantize_distribution.end(), 0);
        
        const float num_per_bin = static_cast<float>(threshold) / target_bin;

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            const int left_upper = ceil(start);
            if (left_upper > start) 
            {
                const float left_scale = left_upper - start;
                quantize_distribution[i] += left_scale * distribution[left_upper - 1];
            }

            const int right_lower = floor(end);

            if (right_lower < end) 
            {

                const float right_scale = end - right_lower;
                quantize_distribution[i] += right_scale * distribution[right_lower];
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                quantize_distribution[i] += distribution[j];
            }
        }

        // get Q
        std::vector<float> expand_distribution(threshold, 0);

        for (int i=0; i<target_bin; i++) 
        {
            const float start = i * num_per_bin;
            const float end = start + num_per_bin;

            float count = 0;

            const int left_upper = ceil(start);
            float left_scale = 0;
            if (left_upper > start) 
            {
                left_scale = left_upper - start;
                if (distribution[left_upper - 1] != 0) 
                {
                    count += left_scale;
                }
            }

            const int right_lower = floor(end);
            float right_scale = 0;
            if (right_lower < end) 
            {
                right_scale = end - right_lower;
                if (distribution[right_lower] != 0) 
                {
                    count += right_scale;
                }
            }

            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    count++;
                }
            }

            const float expand_value = quantize_distribution[i] / count;

            if (left_upper > start) 
            {
                if (distribution[left_upper - 1] != 0) 
                {
                    expand_distribution[left_upper - 1] += expand_value * left_scale;
                }
            }
            if (right_lower < end) 
            {
                if (distribution[right_lower] != 0) 
                {
                    expand_distribution[right_lower] += expand_value * right_scale;
                }
            }
            for (int j=left_upper; j<right_lower; j++) 
            {
                if (distribution[j] != 0) 
                {
                    expand_distribution[j] += expand_value;
                }
            }
        }

        // kl
        float kl_divergence = compute_kl_divergence(t_distribution, expand_distribution);

        // the best num of bin
        if (kl_divergence < min_kl_divergence) 
        {
            min_kl_divergence = kl_divergence;
            target_threshold = threshold;
        }
    }

    return target_threshold;
}